

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int nghttp2_hd_inflate_init(nghttp2_hd_inflater *inflater,nghttp2_mem *mem)

{
  nghttp2_hd_context *in_RSI;
  long in_RDI;
  int rv;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  local_4 = hd_context_init(in_RSI,(nghttp2_mem *)
                                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (local_4 == 0) {
    *(undefined8 *)(in_RDI + 200) = 0x1000;
    *(undefined8 *)(in_RDI + 0xd0) = 0xffffffff;
    *(undefined8 *)(in_RDI + 0xa8) = 0;
    *(undefined8 *)(in_RDI + 0xb0) = 0;
    *(undefined4 *)(in_RDI + 0xe0) = 0;
    *(undefined4 *)(in_RDI + 0xe4) = 1;
    nghttp2_buf_init((nghttp2_buf *)(in_RDI + 0x48));
    nghttp2_buf_init((nghttp2_buf *)(in_RDI + 0x70));
    *(undefined8 *)(in_RDI + 0x98) = 0;
    *(undefined8 *)(in_RDI + 0xa0) = 0;
    *(undefined1 *)(in_RDI + 0xe8) = 0;
    *(undefined8 *)(in_RDI + 0xc0) = 0;
    *(undefined8 *)(in_RDI + 0xb8) = 0;
    *(undefined8 *)(in_RDI + 0xd8) = 0;
    *(undefined1 *)(in_RDI + 0xe9) = 0;
    *(undefined1 *)(in_RDI + 0xea) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nghttp2_hd_inflate_init(nghttp2_hd_inflater *inflater, nghttp2_mem *mem) {
  int rv;

  rv = hd_context_init(&inflater->ctx, mem);
  if (rv != 0) {
    goto fail;
  }

  inflater->settings_hd_table_bufsize_max = NGHTTP2_HD_DEFAULT_MAX_BUFFER_SIZE;
  inflater->min_hd_table_bufsize_max = UINT32_MAX;

  inflater->nv_name_keep = NULL;
  inflater->nv_value_keep = NULL;

  inflater->opcode = NGHTTP2_HD_OPCODE_NONE;
  inflater->state = NGHTTP2_HD_STATE_INFLATE_START;

  nghttp2_buf_init(&inflater->namebuf);
  nghttp2_buf_init(&inflater->valuebuf);

  inflater->namercbuf = NULL;
  inflater->valuercbuf = NULL;

  inflater->huffman_encoded = 0;
  inflater->index = 0;
  inflater->left = 0;
  inflater->shift = 0;
  inflater->index_required = 0;
  inflater->no_index = 0;

  return 0;

fail:
  return rv;
}